

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void btSoftBody::PSolve_Anchors(btSoftBody *psb,btScalar kst,btScalar ti)

{
  long in_RDI;
  float in_XMM0_Da;
  btVector3 bVar1;
  btVector3 bVar2;
  btVector3 impulse;
  btVector3 vr;
  btVector3 vb;
  btVector3 va;
  btVector3 wa;
  Node *n;
  btTransform *t;
  Anchor *a;
  int ni;
  int i;
  btScalar dt;
  btScalar kAHR;
  btVector3 *in_stack_fffffffffffffef8;
  btRigidBody *in_stack_ffffffffffffff00;
  btVector3 in_stack_ffffffffffffff08;
  btVector3 *rel_pos;
  btVector3 local_c8;
  btScalar local_b8 [4];
  btScalar local_a8 [4];
  btScalar local_98 [4];
  btScalar local_88 [4];
  btScalar local_78 [4];
  btScalar local_68 [4];
  btScalar local_58 [4];
  btScalar local_48 [4];
  Node *local_38;
  btTransform *local_30;
  Anchor *local_28;
  int local_20;
  int local_1c;
  undefined4 local_18;
  float local_14;
  long local_8;
  
  local_14 = *(float *)(in_RDI + 0x1a8) * in_XMM0_Da;
  local_18 = *(undefined4 *)(in_RDI + 0x240);
  local_1c = 0;
  local_8 = in_RDI;
  local_20 = btAlignedObjectArray<btSoftBody::Anchor>::size
                       ((btAlignedObjectArray<btSoftBody::Anchor> *)(in_RDI + 0x3f0));
  for (; local_1c < local_20; local_1c = local_1c + 1) {
    local_28 = btAlignedObjectArray<btSoftBody::Anchor>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Anchor> *)(local_8 + 0x3f0),local_1c);
    local_30 = btCollisionObject::getWorldTransform(&local_28->m_body->super_btCollisionObject);
    local_38 = local_28->m_node;
    local_48 = (btScalar  [4])
               btTransform::operator*
                         ((btTransform *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_68 = (btScalar  [4])
               btRigidBody::getVelocityInLocalPoint
                         (in_stack_ffffffffffffff08.m_floats._8_8_,
                          in_stack_ffffffffffffff08.m_floats._0_8_);
    local_58 = (btScalar  [4])
               ::operator*(in_stack_ffffffffffffff08.m_floats._8_8_,
                           in_stack_ffffffffffffff08.m_floats._0_8_);
    local_78 = (btScalar  [4])
               operator-(in_stack_ffffffffffffff08.m_floats._8_8_,
                         in_stack_ffffffffffffff08.m_floats._0_8_);
    local_98 = (btScalar  [4])
               operator-(in_stack_ffffffffffffff08.m_floats._8_8_,
                         in_stack_ffffffffffffff08.m_floats._0_8_);
    local_b8 = (btScalar  [4])
               operator-(in_stack_ffffffffffffff08.m_floats._8_8_,
                         in_stack_ffffffffffffff08.m_floats._0_8_);
    local_a8 = (btScalar  [4])
               ::operator*(in_stack_ffffffffffffff08.m_floats._8_8_,
                           in_stack_ffffffffffffff08.m_floats._0_8_);
    local_88 = (btScalar  [4])
               operator+(in_stack_ffffffffffffff08.m_floats._8_8_,
                         in_stack_ffffffffffffff08.m_floats._0_8_);
    bVar1 = ::operator*(in_stack_ffffffffffffff08.m_floats._8_8_,
                        in_stack_ffffffffffffff08.m_floats._0_8_);
    local_c8 = ::operator*(in_stack_ffffffffffffff08.m_floats._8_8_,
                           in_stack_ffffffffffffff08.m_floats._0_8_);
    in_stack_fffffffffffffef8 = &local_c8;
    bVar2 = ::operator*(in_stack_ffffffffffffff08.m_floats._8_8_,
                        in_stack_ffffffffffffff08.m_floats._0_8_);
    rel_pos = bVar2.m_floats._8_8_;
    btVector3::operator+=(&local_38->m_x,(btVector3 *)&stack0xffffffffffffff18);
    in_stack_ffffffffffffff00 = local_28->m_body;
    in_stack_ffffffffffffff08 = operator-((btVector3 *)in_stack_ffffffffffffff00);
    btRigidBody::applyImpulse(bVar1.m_floats._8_8_,bVar1.m_floats._0_8_,rel_pos);
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_Anchors(btSoftBody* psb,btScalar kst,btScalar ti)
{
	const btScalar	kAHR=psb->m_cfg.kAHR*kst;
	const btScalar	dt=psb->m_sst.sdt;
	for(int i=0,ni=psb->m_anchors.size();i<ni;++i)
	{
		const Anchor&		a=psb->m_anchors[i];
		const btTransform&	t=a.m_body->getWorldTransform();
		Node&				n=*a.m_node;
		const btVector3		wa=t*a.m_local;
		const btVector3		va=a.m_body->getVelocityInLocalPoint(a.m_c1)*dt;
		const btVector3		vb=n.m_x-n.m_q;
		const btVector3		vr=(va-vb)+(wa-n.m_x)*kAHR;
		const btVector3		impulse=a.m_c0*vr*a.m_influence;
		n.m_x+=impulse*a.m_c2;
		a.m_body->applyImpulse(-impulse,a.m_c1);
	}
}